

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall
cfd::core::Psbt::SetTxInRecord(Psbt *this,uint32_t index,ByteData *key,ByteData *value)

{
  byte bVar1;
  void *pvVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  _func_int **pp_Var7;
  uint64_t __n;
  CfdException *pCVar8;
  pointer pvVar9;
  undefined4 in_register_00000034;
  undefined **ppuVar10;
  long lVar11;
  ulong __n_00;
  uint64_t uVar12;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  Transaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  wally_tx_witness_stack *stack;
  wally_tx *wally_tx_obj;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  int local_17c;
  undefined1 local_178 [48];
  undefined1 local_148 [32];
  pointer pTStack_128;
  pointer local_120;
  pointer pTStack_118;
  pointer local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  ByteData local_c0;
  undefined1 local_a8 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  long local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x9dd,"SetTxInRecord");
  local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this->wally_psbt_pointer_;
  bVar4 = ByteData::IsEmpty(key);
  if (bVar4) {
    local_148._0_8_ = "cfdcore_psbt.cpp";
    local_148._8_4_ = 0x9e1;
    local_148._16_6_ = 0x21d28c;
    local_148._22_2_ = 0;
    logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt empty key error.");
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"psbt empty key error.","");
    CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_60,key);
  ByteData::GetBytes(&local_d8,value);
  local_68 = (ulong)index * 0x110;
  lVar11 = *(long *)(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) + local_68;
  if (8 < *(byte *)(wally_map_item **)
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    pp_Var7 = (_func_int **)(local_148 + 0x10);
    local_148._16_6_ = 0x207475706e69;
    local_148._22_2_ = 0x6e75;
    local_148._24_6_ = 0x736e776f6e6b;
    local_148._8_8_ = (undefined **)0xe;
    local_148[0x1e] = '\0';
    local_148._0_8_ = pp_Var7;
    FindPsbtMap((core *)(lVar11 + 0x78),
                (wally_map *)
                local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_148,(size_t *)0x0);
    if ((_func_int **)local_148._0_8_ != pp_Var7) {
      operator_delete((void *)local_148._0_8_);
    }
    local_17c = wally_map_add((core *)(lVar11 + 0x78),
                              local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_60.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_60.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                              local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x49f;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                        &local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var7;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt add input unknowns error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    goto LAB_001c6fb3;
  }
  lVar6 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  switch(*(byte *)(wally_map_item **)
                  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start) {
  case 0:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x3df;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)local_178,&local_d8);
    Transaction::Transaction((Transaction *)local_148,(ByteData *)local_178);
    if ((undefined **)local_178._0_8_ != (undefined **)0x0) {
      operator_delete((void *)local_178._0_8_);
    }
    local_a8._0_8_ = (pointer)0x0;
    AbstractTransaction::GetHex_abi_cxx11_((string *)local_178,(AbstractTransaction *)local_148);
    local_17c = wally_tx_from_hex(local_178._0_8_,0,local_a8);
    ppuVar10 = (undefined **)(local_178 + 0x10);
    if ((undefined **)local_178._0_8_ != ppuVar10) {
      operator_delete((void *)local_178._0_8_);
    }
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 999;
      local_178._16_8_ = "SetPsbtInput";
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_tx_from_hex NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = ppuVar10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt tx from hex error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((*(pointer *)(local_a8._0_8_ + 0x10) == (pointer)0x0) ||
       (*(pointer *)(local_a8._0_8_ + 0x28) == (pointer)0x0)) {
      wally_tx_free(local_a8._0_8_);
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x3ec;
      local_178._16_8_ = "SetPsbtInput";
      logger::log<>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                    "invalind utxo transaction format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = ppuVar10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt invalid tx error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_utxo(lVar11);
    wally_tx_free(local_a8._0_8_);
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x3f3;
      local_178._16_8_ = "SetPsbtInput";
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_psbt_input_set_utxo NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = ppuVar10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt set input utxo error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Transaction::~Transaction((Transaction *)local_148);
    break;
  case 1:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x3f9;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer((Deserializer *)local_178,&local_d8);
    pp_Var7 = (_func_int **)Deserializer::ReadUint64((Deserializer *)local_178);
    Deserializer::ReadVariableBuffer(&local_c0.data_,(Deserializer *)local_178);
    local_f0 = 0;
    uStack_e8 = 0;
    local_100 = 0;
    uStack_f8 = 0;
    local_110 = (pointer)0x0;
    uStack_108 = 0;
    local_120 = (pointer)0x0;
    pTStack_118 = (pointer)0x0;
    local_148._24_6_ = 0;
    local_148[0x1e] = '\0';
    local_148[0x1f] = '\0';
    pTStack_128 = (pointer)0x0;
    local_e0 = 0;
    local_148._8_8_ =
         local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_148._16_6_ =
         (undefined6)
         ((long)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    local_148._22_2_ =
         (undefined2)
         ((ulong)((long)local_c0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_c0.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 0x30);
    local_148._0_8_ = pp_Var7;
    local_17c = wally_psbt_input_set_witness_utxo(lVar11);
    if (local_17c != 0) {
      local_a8._0_8_ = "cfdcore_psbt.cpp";
      local_a8._8_4_ = 0x408;
      local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "SetPsbtInput";
      logger::log<int&>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,
                        "wally_psbt_input_set_witness_utxo NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a8._0_8_ = &local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"psbt set output witnessUtxo error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_a8);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((undefined **)
        local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (undefined **)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_178._0_8_ = &PTR__Deserializer_00259898;
    ppuVar10 = (undefined **)local_178._8_8_;
    goto LAB_001c6fa9;
  case 2:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,lVar6 - 1,
               (allocator_type *)local_148);
    if (local_178._8_8_ - local_178._0_8_ != 0) {
      memcpy((void *)local_178._0_8_,
             (void *)((long)(wally_map_item **)
                            local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),
             local_178._8_8_ - local_178._0_8_);
    }
    ByteData::ByteData(&local_c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178)
    ;
    Pubkey::Pubkey((Pubkey *)local_a8,&local_c0);
    if ((undefined **)
        local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (undefined **)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_148,(Pubkey *)local_a8);
    ByteData::GetBytes(&local_80,(ByteData *)local_148);
    if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_148._0_8_);
    }
    pp_Var7 = (_func_int **)(local_148 + 0x10);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x10;
    local_148._0_8_ = pp_Var7;
    local_148._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_48);
    local_148._16_6_ =
         SUB86(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    local_148._22_2_ =
         (undefined2)
         ((ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 0x30);
    *(undefined8 *)local_148._0_8_ = 0x6973207475706e69;
    *(undefined8 *)(local_148._0_8_ + 8) = 0x7365727574616e67;
    local_148._8_8_ =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)(local_148._0_8_ +
             (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    FindPsbtMap((core *)(lVar11 + 0x60),
                (wally_map *)
                local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_148,(size_t *)0x0);
    if ((_func_int **)local_148._0_8_ != pp_Var7) {
      operator_delete((void *)local_148._0_8_);
    }
    local_17c = wally_map_add((core *)(lVar11 + 0x60),
                              local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_80.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_80.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                              local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x419;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"wally_map_add NG[{}]",
                        &local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var7;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input signatures error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    goto LAB_001c6cf7;
  case 3:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x41f;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((ulong)((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 4) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x424;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid value format.")
      ;
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid value format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_sighash
                          (lVar11,*(undefined4 *)
                                   local_d8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x42d;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_sighash NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input sighash error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 4:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x433;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_redeem_script
                          (lVar11,local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x43a;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_redeem_script NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input redeemScript error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 5:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x440;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_witness_script
                          (lVar11,local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x447;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_witness_script NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input witnessScript error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 6:
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,lVar6 - 1,
               (allocator_type *)local_148);
    if (local_178._8_8_ - local_178._0_8_ != 0) {
      memcpy((void *)local_178._0_8_,
             (void *)((long)(wally_map_item **)
                            local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),
             local_178._8_8_ - local_178._0_8_);
    }
    ByteData::ByteData(&local_c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178)
    ;
    Pubkey::Pubkey((Pubkey *)local_a8,&local_c0);
    if ((undefined **)
        local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (undefined **)0x0) {
      operator_delete(local_c0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_148,(Pubkey *)local_a8);
    ByteData::GetBytes(&local_80,(ByteData *)local_148);
    if ((_func_int **)local_148._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_148._0_8_);
    }
    pp_Var7 = (_func_int **)(local_148 + 0x10);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x12;
    local_148._0_8_ = pp_Var7;
    local_148._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_148,(ulong)&local_48);
    local_148._16_6_ =
         SUB86(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    local_148._22_2_ =
         (undefined2)
         ((ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 0x30);
    *(undefined8 *)local_148._0_8_ = 0x6962207475706e69;
    *(undefined8 *)(local_148._0_8_ + 8) = 0x6b62757020323370;
    *(undefined2 *)(local_148._0_8_ + 0x10) = 0x7965;
    local_148._8_8_ =
         local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)(local_148._0_8_ +
             (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    FindPsbtMap((core *)(lVar11 + 0x48),
                (wally_map *)
                local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_148,(size_t *)0x0);
    if ((_func_int **)local_148._0_8_ != pp_Var7) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((ulong)((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 4) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x455;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid value format.")
      ;
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var7;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid value format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __n_00 = ((long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) - 4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_48,__n_00 >> 2,(allocator_type *)local_148);
    if (__n_00 != 0) {
      memcpy(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,__n_00);
    }
    local_17c = wally_map_add_keypath_item
                          ((core *)(lVar11 + 0x48),
                           local_80.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (long)local_80.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_80.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                           local_d8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,4,
                           local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           (long)local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_48.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x463;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_map_add_keypath_item NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = pp_Var7;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input pubkey error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if ((undefined **)
        local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (undefined **)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
LAB_001c6cf7:
    if ((wally_map *)
        local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_map *)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    ppuVar10 = (undefined **)local_178._0_8_;
    if ((pointer)local_a8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a8._0_8_);
      ppuVar10 = (undefined **)local_178._0_8_;
    }
    goto LAB_001c6fa9;
  case 7:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x469;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_17c = wally_psbt_input_set_final_scriptsig
                          (lVar11,local_d8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x470;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_scriptsig NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt set input final scriptsig error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    break;
  case 8:
    if (lVar6 != 1) {
      local_148._0_8_ = "cfdcore_psbt.cpp";
      local_148._8_4_ = 0x476;
      local_148._16_6_ = 0x21d8bf;
      local_148._22_2_ = 0;
      logger::log<>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_148._0_8_ = local_148 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_148);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    Deserializer::Deserializer((Deserializer *)local_148,&local_d8);
    __n = Deserializer::ReadVariableInt((Deserializer *)local_148);
    ::std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_a8,__n,(allocator_type *)local_178);
    if (__n != 0) {
      lVar6 = 0;
      uVar12 = __n;
      do {
        Deserializer::ReadVariableBuffer
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,
                   (Deserializer *)local_148);
        pvVar2 = *(void **)(local_a8._0_8_ + lVar6);
        *(undefined8 *)(local_a8._0_8_ + lVar6) = local_178._0_8_;
        *(undefined8 *)((pointer)(local_a8._0_8_ + lVar6) + 8) = local_178._8_8_;
        *(undefined8 *)(local_a8._0_8_ + lVar6 + 0x10) = local_178._16_8_;
        local_178._0_8_ = (undefined **)0x0;
        local_178._8_8_ = (undefined **)0x0;
        local_178._16_8_ = (pointer)0x0;
        if ((pvVar2 != (void *)0x0) &&
           (operator_delete(pvVar2), (undefined **)local_178._0_8_ != (undefined **)0x0)) {
          operator_delete((void *)local_178._0_8_);
        }
        lVar6 = lVar6 + 0x18;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_17c = wally_tx_witness_stack_init_alloc(__n);
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x484;
      local_178._16_8_ = "SetPsbtInput";
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_tx_witness_stack_init_alloc NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = local_178 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt alloc witness stack error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    for (pvVar9 = (pointer)local_a8._0_8_; local_17c = 0,
        pvVar9 != (pointer)CONCAT44(local_a8._12_4_,local_a8._8_4_); pvVar9 = pvVar9 + 1) {
      puVar3 = (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_17c = wally_tx_witness_stack_add
                            (local_c0.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,puVar3,
                             (long)(pvVar9->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
      if (local_17c != 0) {
        wally_tx_witness_stack_free
                  (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_178._0_8_ = "cfdcore_psbt.cpp";
        local_178._8_4_ = 0x48d;
        local_178._16_8_ = "SetPsbtInput";
        logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                          "wally_tx_witness_stack_add NG[{}]",&local_17c);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_178._0_8_ = local_178 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"psbt add witness stack error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_178);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    local_17c = wally_psbt_input_set_final_witness
                          (lVar11,local_c0.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    wally_tx_witness_stack_free
              (local_c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
    if (local_17c != 0) {
      local_178._0_8_ = "cfdcore_psbt.cpp";
      local_178._8_4_ = 0x495;
      local_178._16_8_ = "SetPsbtInput";
      logger::log<int&>((CfdSourceLocation *)local_178,kCfdLogLevelWarning,
                        "wally_psbt_input_set_final_witness NG[{}]",&local_17c);
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      local_178._0_8_ = local_178 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"psbt set input final witnessStack error.","");
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)local_178);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_a8);
    local_148._0_8_ = &PTR__Deserializer_00259898;
    ppuVar10 = (undefined **)local_148._8_8_;
LAB_001c6fa9:
    if (ppuVar10 != (undefined **)0x0) {
      operator_delete(ppuVar10);
    }
  }
LAB_001c6fb3:
  bVar1 = *(byte *)(wally_map_item **)
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (bVar1 < 9) {
    if (bVar1 == 6) {
      lVar11 = *(long *)(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) + local_68 + 0x48
      ;
    }
    else {
      if (bVar1 != 2) goto LAB_001c7038;
      lVar11 = *(long *)(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) + local_68 + 0x60
      ;
    }
  }
  else {
    lVar11 = *(long *)(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10) + local_68 + 0x78;
  }
  iVar5 = wally_map_sort(lVar11,0);
  local_178._0_4_ = iVar5;
  if (iVar5 != 0) {
    local_148._0_8_ = "cfdcore_psbt.cpp";
    local_148._8_4_ = 0x9f6;
    local_148._16_6_ = 0x21d28c;
    local_148._22_2_ = 0;
    logger::log<int&>((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"wally_map_sort NG[{}]",
                      (int *)local_178);
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = local_148 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"psbt input sort unknowns error.","");
    CfdException::CfdException(pCVar8,kCfdInternalError,(string *)local_148);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
LAB_001c7038:
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((wally_map *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (wally_map *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Psbt::SetTxInRecord(
    uint32_t index, const ByteData &key, const ByteData &value) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }

  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();
  uint8_t type = SetPsbtInput(key_vec, val_vec, &psbt_pointer->inputs[index]);

  struct wally_map *map_ptr = nullptr;
  if (type <= Psbt::kPsbtInputFinalScriptWitness) {
    if (type == Psbt::kPsbtInputPartialSig) {
      map_ptr = &psbt_pointer->inputs[index].signatures;
    } else if (type == Psbt::kPsbtInputBip32Derivation) {
      map_ptr = &psbt_pointer->inputs[index].keypaths;
    }
  } else {
    map_ptr = &psbt_pointer->inputs[index].unknowns;
  }
  if (map_ptr != nullptr) {
    int ret = wally_map_sort(map_ptr, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt input sort unknowns error.");
    }
  }
}